

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_ppu.cpp
# Opt level: O1

void __thiscall
anon_unknown.dwarf_4be406::PpuTest_nmi_is_triggered_when_it_should_Test::
~PpuTest_nmi_is_triggered_when_it_should_Test(PpuTest_nmi_is_triggered_when_it_should_Test *this)

{
  IPpu *pIVar1;
  void *in_RAX;
  
  (this->super_PpuTest).super_Test._vptr_Test = (_func_int **)&PTR__PpuTest_002ae680;
  pIVar1 = (this->super_PpuTest).ppu._M_t.
           super___uniq_ptr_impl<n_e_s::core::IPpu,_std::default_delete<n_e_s::core::IPpu>_>._M_t.
           super__Tuple_impl<0UL,_n_e_s::core::IPpu_*,_std::default_delete<n_e_s::core::IPpu>_>.
           super__Head_base<0UL,_n_e_s::core::IPpu_*,_false>._M_head_impl;
  if (pIVar1 != (IPpu *)0x0) {
    (*pIVar1->_vptr_IPpu[1])();
  }
  (this->super_PpuTest).ppu._M_t.
  super___uniq_ptr_impl<n_e_s::core::IPpu,_std::default_delete<n_e_s::core::IPpu>_>._M_t.
  super__Tuple_impl<0UL,_n_e_s::core::IPpu_*,_std::default_delete<n_e_s::core::IPpu>_>.
  super__Head_base<0UL,_n_e_s::core::IPpu_*,_false>._M_head_impl = (IPpu *)0x0;
  (this->super_PpuTest).mmu.super_MockMmu.super_IMmu._vptr_IMmu =
       (_func_int **)&PTR__MockMmu_002a0898;
  testing::internal::FunctionMocker<void_(unsigned_short,_unsigned_char)>::~FunctionMocker
            (&(this->super_PpuTest).mmu.super_MockMmu.gmock02_write_byte_15);
  testing::internal::FunctionMocker<unsigned_char_(unsigned_short)>::~FunctionMocker
            (&(this->super_PpuTest).mmu.super_MockMmu.gmock11_read_byte_14);
  testing::internal::
  FunctionMocker<void_(std::vector<std::unique_ptr<n_e_s::core::IMemBank,_std::default_delete<n_e_s::core::IMemBank>_>,_std::allocator<std::unique_ptr<n_e_s::core::IMemBank,_std::default_delete<n_e_s::core::IMemBank>_>_>_>)>
  ::~FunctionMocker(&(this->super_PpuTest).mmu.super_MockMmu.gmock01_set_mem_banks_12);
  testing::Mock::UnregisterCallReaction(in_RAX);
  testing::Test::~Test((Test *)this);
  operator_delete(this,0x138);
  return;
}

Assistant:

TEST_F(PpuTest, nmi_is_triggered_when_it_should) {
    bool triggered = false;
    registers.ctrl = expected.ctrl = PpuCtrl(0b1000'0000u);
    ppu->set_nmi_handler([&] { triggered = true; });

    // Nmi shouldn't get triggered before the start of vblanking.
    step_execution(kCyclesPerScanline * 241 + 1);
    ASSERT_FALSE(triggered);
    EXPECT_EQ(241, ppu->scanline());
    EXPECT_EQ(1, ppu->cycle());

    step_execution(1);
    ASSERT_TRUE(triggered);
    EXPECT_EQ(241, ppu->scanline());
    EXPECT_EQ(2, ppu->cycle());

    // Nmi should only be triggered on scanline 241.
    triggered = false;
    step_execution(kCyclesPerScanline);
    ASSERT_FALSE(triggered);
    EXPECT_EQ(242, ppu->scanline());
    EXPECT_EQ(2, ppu->cycle());
}